

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_meta.c
# Opt level: O1

int lj_meta_tailcall(lua_State *L,cTValue *tv)

{
  TValue *pTVar1;
  TValue *pTVar2;
  TValue *pTVar3;
  TValue TVar4;
  
  pTVar2 = L->base;
  pTVar3 = L->top;
  TVar4 = pTVar2[-1];
  pTVar2[-2] = *tv;
  pTVar3->u64 = 0;
  pTVar3[1] = TVar4;
  pTVar3[2].u64 = (ulong)L | 0xfffc800000000000;
  pTVar1 = pTVar3 + 4;
  pTVar3[3].u64 = (long)pTVar1 + (2 - (long)pTVar2);
  L->top = pTVar1;
  L->base = pTVar1;
  return 0;
}

Assistant:

int lj_meta_tailcall(lua_State *L, cTValue *tv)
{
  TValue *base = L->base;
  TValue *top = L->top;
  const BCIns *pc = frame_pc(base-1);  /* Preserve old PC from frame. */
  copyTV(L, base-1-LJ_FR2, tv);  /* Replace frame with new object. */
  if (LJ_FR2)
    (top++)->u64 = LJ_CONT_TAILCALL;
  else
    top->u32.lo = LJ_CONT_TAILCALL;
  setframe_pc(top++, pc);
  setframe_gc(top, obj2gco(L), LJ_TTHREAD);  /* Dummy frame object. */
  if (LJ_FR2) top++;
  setframe_ftsz(top, ((char *)(top+1) - (char *)base) + FRAME_CONT);
  L->base = L->top = top+1;
  /*
  ** before:   [old_mo|PC]    [... ...]
  **                         ^base     ^top
  ** after:    [new_mo|itype] [... ...] [NULL|PC] [dummy|delta]
  **                                                           ^base/top
  ** tailcall: [new_mo|PC]    [... ...]
  **                         ^base     ^top
  */
  return 0;
}